

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall
QToolBarAreaLayoutInfo::insertToolBarBreak(QToolBarAreaLayoutInfo *this,QToolBar *before)

{
  pointer pQVar1;
  QToolBar *pQVar2;
  long lVar3;
  ulong pos;
  ulong uVar4;
  QList<QToolBarAreaLayoutItem> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_80;
  QToolBarAreaLayoutLine local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (before == (QToolBar *)0x0) {
    lVar3 = (this->lines).d.size;
    if ((lVar3 == 0) || ((this->lines).d.ptr[lVar3 + -1].toolBarItems.d.size != 0)) {
      local_68.rect.x1.m_i = 0;
      local_68.rect.y1.m_i = 0;
      local_68.rect.x2.m_i = -1;
      local_68.rect.y2.m_i = -1;
      local_68.o = this->o;
      local_68.toolBarItems.d.d = (Data *)0x0;
      local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
      local_68.toolBarItems.d.size = 0;
      QList<QToolBarAreaLayoutLine>::emplaceBack<QToolBarAreaLayoutLine>(&this->lines,&local_68);
LAB_0046e84c:
      QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_68.toolBarItems.d);
    }
  }
  else {
    for (uVar4 = 0; uVar4 < (ulong)(this->lines).d.size; uVar4 = uVar4 + 1) {
      pQVar1 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      this_00 = &pQVar1[uVar4].toolBarItems;
      lVar3 = 0;
      for (pos = 0; pos < (ulong)pQVar1[uVar4].toolBarItems.d.size; pos = pos + 1) {
        pQVar2 = (QToolBar *)
                 (**(code **)(**(long **)((long)&(pQVar1[uVar4].toolBarItems.d.ptr)->widgetItem +
                                         lVar3) + 0x68))();
        if (pQVar2 == before) {
          if (lVar3 == 0) goto LAB_0046e851;
          local_68.rect.x1.m_i = 0;
          local_68.rect.y1.m_i = 0;
          local_68.rect.x2.m_i = -1;
          local_68.rect.y2.m_i = -1;
          local_68._20_4_ = 0xaaaaaaaa;
          local_68.o = this->o;
          local_68.toolBarItems.d.d = (Data *)0x0;
          local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
          local_68.toolBarItems.d.size = 0;
          QList<QToolBarAreaLayoutItem>::mid
                    ((QList<QToolBarAreaLayoutItem> *)&local_80,this_00,pos,-1);
          QArrayDataPointer<QToolBarAreaLayoutItem>::operator=(&local_68.toolBarItems.d,&local_80);
          QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_80);
          QList<QToolBarAreaLayoutItem>::mid
                    ((QList<QToolBarAreaLayoutItem> *)&local_80,this_00,0,pos);
          QArrayDataPointer<QToolBarAreaLayoutItem>::operator=(&this_00->d,&local_80);
          QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_80);
          QList<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine_const&>
                    (&this->lines,(ulong)((int)uVar4 + 1),&local_68);
          goto LAB_0046e84c;
        }
        lVar3 = lVar3 + 0x18;
      }
    }
  }
LAB_0046e851:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarAreaLayoutInfo::insertToolBarBreak(QToolBar *before)
{
    if (before == nullptr) {
        if (!lines.isEmpty() && lines.constLast().toolBarItems.isEmpty())
            return;
        lines.append(QToolBarAreaLayoutLine(o));
        return;
    }

    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            if (line.toolBarItems.at(k).widgetItem->widget() == before) {
                if (k == 0)
                    return;

                QToolBarAreaLayoutLine newLine(o);
                newLine.toolBarItems = line.toolBarItems.mid(k);
                line.toolBarItems = line.toolBarItems.mid(0, k);
                lines.insert(j + 1, newLine);

                return;
            }
        }
    }
}